

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O1

int container_at(int x,int y,boolean countem)

{
  short *psVar1;
  int iVar2;
  obj *poVar3;
  
  iVar2 = 0;
  if ((level->locations[x][y].typ == '\x1e') && (iVar2 = 1, countem == '\0')) {
    return 1;
  }
  poVar3 = level->objects[x][y];
  do {
    if (poVar3 == (obj *)0x0) {
      return iVar2;
    }
    psVar1 = &poVar3->otyp;
    poVar3 = (poVar3->v).v_nexthere;
  } while ((7 < (ushort)(*psVar1 - 0xdaU)) || (iVar2 = iVar2 + 1, countem != '\0'));
  return iVar2;
}

Assistant:

static int container_at(int x, int y, boolean countem)
{
	struct obj *cobj, *nobj;
	int container_count = 0;

	/*
	 * WARNING: Magic chests are terrain features, not objects, so a
	 * non-zero return value from this function doesn't necessarily mean
	 * there's an object at this location.
	 */
	if (IS_MAGIC_CHEST(level->locations[x][y].typ)) {
		if (countem)
			container_count++;
		else
			return 1;
	}

	for (cobj = level->objects[x][y]; cobj; cobj = nobj) {
		nobj = cobj->nexthere;
		if (Is_container(cobj)) {
			container_count++;
			if (!countem) break;
		}
	}
	return container_count;
}